

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meld.cpp
# Opt level: O0

bool __thiscall mahjong::Meld::isMultiWait(Meld *this,Tile last_tile)

{
  bool bVar1;
  const_reference pvVar2;
  IsTerminal local_20;
  IsSame local_1f;
  IsTerminal local_1e;
  IsSame local_1d;
  Tile local_1c;
  Meld *pMStack_18;
  Tile last_tile_local;
  Meld *this_local;
  
  if ((this->is_open & 1U) == 0) {
    local_1c = last_tile;
    pMStack_18 = this;
    bVar1 = isTripletOrQuad(this);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      pvVar2 = std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::front(&this->tiles);
      bVar1 = IsSame::operator()(&local_1d,pvVar2,&local_1c);
      if (bVar1) {
        pvVar2 = std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::back(&this->tiles);
        bVar1 = IsTerminal::operator()(&local_1e,pvVar2);
        this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
      }
      else {
        pvVar2 = std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::back(&this->tiles);
        bVar1 = IsSame::operator()(&local_1f,pvVar2,&local_1c);
        if (bVar1) {
          pvVar2 = std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::front(&this->tiles);
          bVar1 = IsTerminal::operator()(&local_20,pvVar2);
          this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Meld::isMultiWait(Tile last_tile) const
{
	if (is_open) return false;
	if (isTripletOrQuad()) return false;

	if (IsSame()(tiles.front(), last_tile))
	{
		return !IsTerminal()(tiles.back());
	}

	if (IsSame()(tiles.back(), last_tile))
	{
		return !IsTerminal()(tiles.front());
	}

	return false;
}